

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

int Abc_NtkGetLargeNodeNum(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)pNtk->vObjs->nSize;
  if (0 < lVar3) {
    lVar4 = 0;
    iVar2 = 0;
    do {
      pvVar1 = pNtk->vObjs->pArray[lVar4];
      if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 7)) {
        iVar2 = iVar2 + (uint)(1 < *(int *)((long)pvVar1 + 0x1c));
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
    return iVar2;
  }
  return 0;
}

Assistant:

int Abc_NtkGetLargeNodeNum( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, Counter = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
        Counter += (Abc_ObjFaninNum(pNode) > 1);
    return Counter;
}